

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionClrStr.cpp
# Opt level: O2

void __thiscall
Hpipe::InstructionClrStr::write_cpp_code_seq
          (InstructionClrStr *this,StreamSepMaker *ss,StreamSepMaker *es,CppEmitter *cpp_emitter,
          string repl_data,string repl_buf)

{
  StreamSep *this_00;
  StreamSep SStack_58;
  
  StreamSepMaker::operator<<(&SStack_58,ss,(char (*) [12])0x178662);
  this_00 = StreamSep::operator<<(&SStack_58,&this->var);
  StreamSep::operator<<(this_00,(char (*) [10])".clear();");
  StreamSep::~StreamSep(&SStack_58);
  return;
}

Assistant:

void InstructionClrStr::write_cpp_code_seq( StreamSepMaker &ss, StreamSepMaker &es, CppEmitter *cpp_emitter, std::string repl_data, std::string repl_buf ) {
    ss << "HPIPE_DATA." << var << ".clear();";
}